

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StrAccumAppend(StrAccum *p,char *z,int N)

{
  long lVar1;
  char *local_40;
  i64 szNew;
  char *zOld;
  char *zNew;
  int N_local;
  char *z_local;
  StrAccum *p_local;
  
  if (p->tooBig == '\0' && p->mallocFailed == '\0') {
    zNew._4_4_ = N;
    if (N < 0) {
      zNew._4_4_ = sqlite3Strlen30(z);
    }
    if ((zNew._4_4_ != 0) && (z != (char *)0x0)) {
      if (p->nAlloc <= p->nChar + zNew._4_4_) {
        if (p->useMalloc == '\0') {
          p->tooBig = '\x01';
          zNew._4_4_ = (p->nAlloc - p->nChar) + -1;
          if (zNew._4_4_ < 1) {
            return;
          }
        }
        else {
          if (p->zText == p->zBase) {
            local_40 = (char *)0x0;
          }
          else {
            local_40 = p->zText;
          }
          lVar1 = (long)(zNew._4_4_ + 1) + (long)p->nChar;
          if (p->mxAlloc < lVar1) {
            sqlite3StrAccumReset(p);
            p->tooBig = '\x01';
            return;
          }
          p->nAlloc = (int)lVar1;
          if (p->useMalloc == '\x01') {
            zOld = (char *)sqlite3DbRealloc(p->db,local_40,p->nAlloc);
          }
          else {
            zOld = (char *)sqlite3_realloc(local_40,p->nAlloc);
          }
          if (zOld == (char *)0x0) {
            p->mallocFailed = '\x01';
            sqlite3StrAccumReset(p);
            return;
          }
          if ((local_40 == (char *)0x0) && (0 < p->nChar)) {
            memcpy(zOld,p->zText,(long)p->nChar);
          }
          p->zText = zOld;
        }
      }
      memcpy(p->zText + p->nChar,z,(long)zNew._4_4_);
      p->nChar = zNew._4_4_ + p->nChar;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumAppend(StrAccum *p, const char *z, int N){
  assert( z!=0 || N==0 );
  if( p->tooBig | p->mallocFailed ){
    testcase(p->tooBig);
    testcase(p->mallocFailed);
    return;
  }
  assert( p->zText!=0 || p->nChar==0 );
  if( N<0 ){
    N = sqlite3Strlen30(z);
  }
  if( N==0 || NEVER(z==0) ){
    return;
  }
  if( p->nChar+N >= p->nAlloc ){
    char *zNew;
    if( !p->useMalloc ){
      p->tooBig = 1;
      N = p->nAlloc - p->nChar - 1;
      if( N<=0 ){
        return;
      }
    }else{
      char *zOld = (p->zText==p->zBase ? 0 : p->zText);
      i64 szNew = p->nChar;
      szNew += N + 1;
      if( szNew > p->mxAlloc ){
        sqlite3StrAccumReset(p);
        p->tooBig = 1;
        return;
      }else{
        p->nAlloc = (int)szNew;
      }
      if( p->useMalloc==1 ){
        zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
      }else{
        zNew = sqlite3_realloc(zOld, p->nAlloc);
      }
      if( zNew ){
        if( zOld==0 && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
        p->zText = zNew;
      }else{
        p->mallocFailed = 1;
        sqlite3StrAccumReset(p);
        return;
      }
    }
  }
  assert( p->zText );
  memcpy(&p->zText[p->nChar], z, N);
  p->nChar += N;
}